

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O1

ParseNodePtr __thiscall ParseNode::GetFormalNext(ParseNode *this)

{
  code *pcVar1;
  bool bVar2;
  long lVar3;
  undefined4 *puVar4;
  
  if (this->nop == knopParamPattern) {
    AsParseNodeParamPattern(this);
    lVar3 = 0x18;
  }
  else {
    if (2 < (byte)(this->nop + ~knopList)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/ptree.cpp"
                         ,0x11f,"(IsVarLetOrConst())","IsVarLetOrConst()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    AsParseNodeVar(this);
    lVar3 = 0x10;
  }
  return *(ParseNodePtr *)(&this->nop + lVar3);
}

Assistant:

ParseNodePtr ParseNode::GetFormalNext()
{
    ParseNodePtr pnodeNext = nullptr;

    if (nop == knopParamPattern)
    {
        pnodeNext = this->AsParseNodeParamPattern()->pnodeNext;
    }
    else
    {
        Assert(IsVarLetOrConst());
        pnodeNext = this->AsParseNodeVar()->pnodeNext;
    }
    return pnodeNext;
}